

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate2<double>::apply
          (QGate2<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,int offset
          )

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  uint __line;
  int iVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  char *__assertion;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  SquareMatrix<double> mat2;
  SquareMatrix<double> local_68;
  SquareMatrix<double> local_58;
  vector<int,_std::allocator<int>_> qubits;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    __line = 0x23;
  }
  else {
    bVar9 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar9 & 0x1f))) {
      (*(this->super_QObject<double>)._vptr_QObject[5])(&qubits,this);
      iVar6 = *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + offset;
      *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = iVar6;
      iVar23 = offset + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[1];
      qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = iVar23;
      if (iVar6 < nbQubits) {
        if (iVar23 < nbQubits) {
          if (iVar6 + 1 == iVar23) {
            (*(this->super_QObject<double>)._vptr_QObject[7])(&mat2,this);
            dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,&mat2);
            if (side == Left) {
              if (nbQubits == 2) {
                dense::SquareMatrix<double>::operator*=(matrix,&mat2);
              }
              else {
                bVar5 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start & 0x1f;
                lVar21 = (long)(1 << (~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[1] + bVar9 &
                                     0x1f));
                uVar16 = 0;
                lVar7 = 0;
                if (0 < lVar21) {
                  lVar7 = lVar21;
                }
                lVar18 = matrix->size_;
                uVar8 = (ulong)(uint)(1 << bVar5);
                if (1 << bVar5 < 1) {
                  uVar8 = uVar16;
                }
                lVar12 = 0;
                if (0 < lVar18) {
                  lVar12 = lVar18;
                }
                lVar21 = lVar21 * lVar18;
                lVar20 = lVar21 * 0x20;
                lVar25 = lVar21 * 8;
                lVar27 = lVar21 * 0x18;
                lVar21 = lVar21 * 0x10;
                for (lVar11 = 0; lVar11 != lVar12; lVar11 = lVar11 + 1) {
                  uVar15 = uVar16;
                  lVar22 = lVar21;
                  lVar24 = lVar25;
                  lVar28 = lVar27;
                  for (uVar19 = 0; uVar19 != uVar8; uVar19 = uVar19 + 1) {
                    pdVar13 = (matrix->data_)._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl;
                    lVar10 = mat2.size_ * 0x10;
                    lVar26 = mat2.size_ * 0x18;
                    pdVar14 = (double *)((long)pdVar13 + uVar15);
                    lVar17 = lVar7;
                    while (bVar29 = lVar17 != 0, lVar17 = lVar17 + -1, bVar29) {
                      dVar1 = *pdVar14;
                      dVar2 = *(double *)((long)pdVar13 + lVar24);
                      dVar3 = *(double *)((long)pdVar13 + lVar22);
                      dVar4 = *(double *)((long)pdVar13 + lVar28);
                      *pdVar14 = *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18
                                  ) * dVar4 +
                                 *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10
                                  ) * dVar3 +
                                 *(double *)
                                  mat2.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                                 *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) *
                                 dVar2;
                      *(double *)((long)pdVar13 + lVar24) =
                           *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18 +
                            mat2.size_ * 8) * dVar4 +
                           *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 +
                            mat2.size_ * 8) * dVar3 +
                           *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl +
                            mat2.size_ * 8) * dVar1 +
                           *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 8 +
                            mat2.size_ * 8) * dVar2;
                      *(double *)((long)pdVar13 + lVar22) =
                           *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18 +
                            lVar10) * dVar4 +
                           *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 +
                            lVar10) * dVar3 +
                           *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar10) *
                           dVar1 + *(double *)
                                    ((long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8
                                    + lVar10) * dVar2;
                      *(double *)((long)pdVar13 + lVar28) =
                           dVar4 * *(double *)
                                    ((long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                     0x18 + lVar26) +
                           dVar3 * *(double *)
                                    ((long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                     0x10 + lVar26) +
                           dVar1 * *(double *)
                                    ((long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                    lVar26) +
                           dVar2 * *(double *)
                                    ((long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8
                                    + lVar26);
                      pdVar14 = pdVar14 + lVar18;
                      pdVar13 = pdVar13 + lVar18;
                    }
                    uVar15 = uVar15 + lVar20;
                    lVar24 = lVar24 + lVar20;
                    lVar22 = lVar22 + lVar20;
                    lVar28 = lVar28 + lVar20;
                  }
                  uVar16 = uVar16 + 8;
                  lVar25 = lVar25 + 8;
                  lVar21 = lVar21 + 8;
                  lVar27 = lVar27 + 8;
                }
              }
            }
            else if (nbQubits == 2) {
              dense::SquareMatrix<double>::SquareMatrix(&local_68,&mat2);
              dense::operator*((dense *)&local_58,&local_68,matrix);
              dense::SquareMatrix<double>::operator=(matrix,&local_58);
              std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
                        (&local_58.data_);
              std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
                        (&local_68.data_);
            }
            else {
              bVar5 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start & 0x1f;
              lVar21 = (long)(1 << (~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[1] + bVar9 &
                                   0x1f));
              uVar16 = 0;
              lVar7 = 0;
              if (0 < lVar21) {
                lVar7 = lVar21;
              }
              lVar18 = matrix->size_;
              uVar8 = (ulong)(uint)(1 << bVar5);
              if (1 << bVar5 < 1) {
                uVar8 = uVar16;
              }
              lVar12 = 0;
              if (0 < lVar18) {
                lVar12 = lVar18;
              }
              lVar18 = lVar18 * 8;
              lVar20 = lVar21 * 0x20;
              lVar25 = lVar21 * 8;
              lVar27 = lVar21 * 0x18;
              lVar21 = lVar21 << 4;
              for (lVar11 = 0; lVar11 != lVar12; lVar11 = lVar11 + 1) {
                uVar15 = uVar16;
                lVar22 = lVar27;
                lVar24 = lVar25;
                lVar28 = lVar21;
                for (uVar19 = 0; uVar19 != uVar8; uVar19 = uVar19 + 1) {
                  pdVar14 = (matrix->data_)._M_t.
                            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl;
                  lVar10 = mat2.size_ * 0x10;
                  lVar26 = mat2.size_ * 0x18;
                  lVar17 = lVar7;
                  while (bVar29 = lVar17 != 0, lVar17 = lVar17 + -1, bVar29) {
                    dVar1 = *(double *)((long)pdVar14 + uVar15);
                    dVar2 = *(double *)((long)pdVar14 + lVar24);
                    dVar3 = *(double *)((long)pdVar14 + lVar28);
                    dVar4 = *(double *)((long)pdVar14 + lVar22);
                    *(double *)((long)pdVar14 + uVar15) =
                         *(double *)
                          ((long)mat2.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar26) *
                         dVar4 + *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                  lVar10) * dVar3 +
                                 *(double *)
                                  mat2.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl * dVar1 +
                                 *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                  mat2.size_ * 8) * dVar2;
                    *(double *)((long)pdVar14 + lVar24) =
                         *(double *)
                          ((long)mat2.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + 8 + lVar26) *
                         dVar4 + *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8 +
                                  lVar10) * dVar3 +
                                 *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) *
                                 dVar1 + *(double *)
                                          ((long)mat2.data_._M_t.
                                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                                 .super__Head_base<0UL,_double_*,_false>.
                                                 _M_head_impl + 8 + mat2.size_ * 8) * dVar2;
                    *(double *)((long)pdVar14 + lVar28) =
                         *(double *)
                          ((long)mat2.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar26
                          ) * dVar4 +
                         *(double *)
                          ((long)mat2.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar10
                          ) * dVar3 +
                         *(double *)
                          ((long)mat2.data_._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) * dVar1
                         + *(double *)
                            ((long)mat2.data_._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 +
                            mat2.size_ * 8) * dVar2;
                    *(double *)((long)pdVar14 + lVar22) =
                         dVar4 * *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18
                                  + lVar26) +
                         dVar3 * *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18
                                  + lVar10) +
                         dVar1 * *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18
                                  ) +
                         dVar2 * *(double *)
                                  ((long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18
                                  + mat2.size_ * 8);
                    pdVar14 = pdVar14 + 1;
                  }
                  uVar15 = uVar15 + lVar20;
                  lVar24 = lVar24 + lVar20;
                  lVar22 = lVar22 + lVar20;
                  lVar28 = lVar28 + lVar20;
                }
                uVar16 = uVar16 + lVar18;
                lVar25 = lVar25 + lVar18;
                lVar27 = lVar27 + lVar18;
                lVar21 = lVar21 + lVar18;
              }
            }
            std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&mat2.data_);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&qubits.super__Vector_base<int,_std::allocator<int>_>);
            return;
          }
          __assertion = "qubits[0] + 1 == qubits[1]";
          __line = 0x29;
          goto LAB_0038e267;
        }
        __assertion = "qubits[1] < nbQubits";
      }
      else {
        __assertion = "qubits[0] < nbQubits";
      }
      __line = 0x28;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      __line = 0x24;
    }
  }
LAB_0038e267:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,__line,
                "virtual void qclab::qgates::QGate2<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }